

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scfx_rep.cpp
# Opt level: O1

void * __thiscall sc_dt::scfx_rep::operator_new(scfx_rep *this,size_t size)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  undefined8 *puVar3;
  long *plVar4;
  long lVar5;
  undefined1 auVar6 [16];
  long lVar7;
  
  if (this != (scfx_rep *)0x28) {
    pvVar2 = ::operator_new((ulong)this);
    return pvVar2;
  }
  if (list == (undefined8 *)0x0) {
    puVar3 = (undefined8 *)operator_new__(0xa000);
    auVar1 = _DAT_0021e870;
    plVar4 = puVar3 + 5;
    lVar5 = 0x400;
    auVar6 = _DAT_0021e860;
    list = puVar3;
    do {
      if (SUB164(auVar6 ^ auVar1,4) == -0x80000000 && SUB164(auVar6 ^ auVar1,0) < -0x7ffffc01) {
        plVar4[-5] = (long)plVar4;
        *plVar4 = (long)(plVar4 + 5);
      }
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
      plVar4 = plVar4 + 10;
      lVar5 = lVar5 + -2;
    } while (lVar5 != 0);
    puVar3[0x13fb] = 0;
  }
  puVar3 = list;
  list = (undefined8 *)*list;
  return puVar3;
}

Assistant:

void*
scfx_rep::operator new( std::size_t size )
{
    const int ALLOC_SIZE = 1024;

    if( size != sizeof( scfx_rep ) )
	return ::operator new( size );

    if( ! list )
    {
	list = new scfx_rep_node[ALLOC_SIZE];
	for( int i = 0; i < ALLOC_SIZE - 1; i ++ )
	    list[i].next = list + i + 1;
	list[ALLOC_SIZE - 1].next = 0;
    }

    scfx_rep* ptr = reinterpret_cast<scfx_rep*>( list->data );
    list = list->next;

    return ptr;
}